

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

StringMakerBase<true> * __thiscall
Catch::Detail::StringMakerBase<true>::convert<long>(StringMakerBase<true> *this,long *_value)

{
  ostringstream local_190 [8];
  ostringstream oss;
  long *_value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,*_value);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

static std::string convert( T const& _value ) {
            std::ostringstream oss;
            oss << _value;
            return oss.str();
        }